

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  TaskFunc p_Var1;
  Walker local_1e8;
  Expression *local_20;
  Expression *curr_local;
  
  local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep = (Expression **)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed = 0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currFunction = (Function *)0x0
  ;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule = (Module *)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.usedFixed = 0;
  local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.mapper.otherIndex = 0;
  local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_20 = curr;
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)&local_1e8,
             ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan,
             &local_20);
  while( true ) {
    if (((long)local_1e8.
               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_1e8.
               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) +
        local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed == 0) {
      uniquify::Walker::~Walker(&local_1e8);
      return;
    }
    if (local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed == 0)
      {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                      ,0x5a,
                      "T &wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
                     );
      }
      p_Var1 = (TaskFunc)
               local_1e8.
               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
               _M_elems[local_1e8.
                        super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                        .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                        usedFixed - 1].func;
      local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
           local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems
           [local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed - 1]
           .currp;
      local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed =
           local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed - 1;
    }
    else {
      p_Var1 = local_1e8.
               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].func;
      local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
           local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
      local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
           super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    if (*local_1e8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
         super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
         super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
        (Expression *)0x0) break;
    (*p_Var1)(&local_1e8,
              local_1e8.
              super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                ,0x139,
                "void wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::UnifiedExpressionVisitor<Walker>]"
               );
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  };

  Walker walker;
  walker.walk(curr);
}